

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  pointer pcVar1;
  stringstream out;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  App::get_display_name_abi_cxx11_(&local_1c8,sub,true);
  pcVar1 = (sub->description_)._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + (sub->description_)._M_string_length);
  detail::format_help(local_198,&local_1c8,&local_1e8,(this->super_FormatterBase).column_width_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    detail::format_help(out, sub->get_display_name(true), sub->get_description(), column_width_);
    return out.str();
}